

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O2

void Server::remove_from_hook<HTTPResponse*(*)(Client*)>
               (vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
                *hook,_func_HTTPResponse_ptr_Client_ptr *func)

{
  long *plVar1;
  long *__dest;
  long *__src;
  
  __dest = *(long **)hook;
  while( true ) {
    if (__dest == *(long **)(hook + 8)) {
      return;
    }
    if ((_func_HTTPResponse_ptr_Client_ptr *)*__dest == func) break;
    __dest = __dest + 1;
  }
  __src = __dest + 1;
  plVar1 = *(long **)(hook + 8);
  if (__src != plVar1) {
    memmove(__dest,__src,(long)plVar1 - (long)__src);
    plVar1 = *(long **)(hook + 8);
  }
  *(long **)(hook + 8) = plVar1 + -1;
  return;
}

Assistant:

static void remove_from_hook(std::vector<T> &hook, T func) {
        for (auto i = hook.begin(); i != hook.end(); ++i) {
            if (*i == func) {
                hook.erase(i);
                return;
            }
        }
    }